

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_lock.cpp
# Opt level: O3

unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> __thiscall
duckdb::StorageLockInternals::TryUpgradeCheckpointLock
          (StorageLockInternals *this,StorageLockKey *lock)

{
  int iVar1;
  element_type *this_00;
  InternalException *this_01;
  long in_RDX;
  enable_shared_from_this<duckdb::StorageLockInternals> local_58;
  undefined1 local_48 [40];
  
  if (*(int *)(in_RDX + 0x10) != 0) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._0_8_ = local_48 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"StorageLock::TryUpgradeLock called on an exclusive lock","");
    InternalException::InternalException(this_01,(string *)local_48);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)&lock->type);
  if (iVar1 == 0) {
    if (lock[2].internals.internal.
        super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001) {
      enable_shared_from_this<duckdb::StorageLockInternals>::shared_from_this(&local_58);
      this_00 = (element_type *)operator_new(0x18);
      local_48._0_8_ =
           local_58.__weak_this_.internal.
           super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_48._8_8_ =
           local_58.__weak_this_.internal.
           super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      local_58.__weak_this_.internal.
      super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_58.__weak_this_.internal.
      super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      StorageLockKey::StorageLockKey
                ((StorageLockKey *)this_00,
                 (shared_ptr<duckdb::StorageLockInternals,_true> *)local_48,EXCLUSIVE);
      (this->super_enable_shared_from_this<duckdb::StorageLockInternals>).__weak_this_.internal.
      super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
      }
      if (local_58.__weak_this_.internal.
          super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
               (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
               this;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.__weak_this_.internal.
                 super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      return (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
             (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)this;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&lock->type);
  }
  (this->super_enable_shared_from_this<duckdb::StorageLockInternals>).__weak_this_.internal.
  super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
         (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)this;
}

Assistant:

unique_ptr<StorageLockKey> TryUpgradeCheckpointLock(StorageLockKey &lock) {
		if (lock.GetType() != StorageLockType::SHARED) {
			throw InternalException("StorageLock::TryUpgradeLock called on an exclusive lock");
		}
		if (!exclusive_lock.try_lock()) {
			// could not lock mutex
			return nullptr;
		}
		if (read_count != 1) {
			// other shared locks are active: failed to upgrade
			D_ASSERT(read_count != 0);
			exclusive_lock.unlock();
			return nullptr;
		}
		// no other shared locks active: success!
		return make_uniq<StorageLockKey>(shared_from_this(), StorageLockType::EXCLUSIVE);
	}